

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gs.c
# Opt level: O1

int32 gs_mgau_shortlist(gs_t *gs,int m,int n,float32 *feat,int bst_codeid)

{
  uint uVar1;
  int32 *piVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  if (n < 1) {
    iVar4 = 0;
  }
  else {
    uVar1 = (*gs->codemap[m])[bst_codeid];
    iVar4 = 0;
    uVar3 = 0;
    do {
      if ((uVar1 >> (uVar3 & 0x1f) & 1) != 0) {
        lVar6 = (long)iVar4;
        iVar4 = iVar4 + 1;
        gs->mgau_sl[lVar6] = uVar3;
      }
      uVar3 = uVar3 + 1;
    } while (n != uVar3);
  }
  piVar2 = gs->mgau_sl;
  piVar2[iVar4] = -1;
  if (iVar4 == 0) {
    if (n < 1) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        piVar2[uVar5] = (int32)uVar5;
        uVar5 = uVar5 + 1;
      } while ((uint)n != uVar5);
    }
    iVar4 = (int)uVar5;
    piVar2[uVar5 & 0xffffffff] = -1;
  }
  if (iVar4 == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x127,"No active gaussian found in senone %d, with num. component = %d\n",m);
  }
  return iVar4;
}

Assistant:

int32
gs_mgau_shortlist(gs_t * gs, int m, int n, float32 * feat, int bst_codeid)
{
    uint32 map;
    int32 bit_id;
    int32 nc;
    nc = 0;

    map = 0;
    map = gs->codemap[m][0][bst_codeid];

#if 0
    E_INFO("The map is %u, the length of gaussian %d\n", map, n);
#endif

    for (bit_id = 0; bit_id < n; bit_id++) {
        if (map & (1 << bit_id))
            gs->mgau_sl[nc++] = bit_id;
    }
    gs->mgau_sl[nc] = -1;

    if (nc == 0) {
        /* 20040222 ARCHAN : added to safe guard Gaussian Selection anomality */
        /* Special case when the number of components is smaller than the max. */
        /* This happens when zero vectors were removed from the codebook. */

        for (bit_id = 0; bit_id < n; bit_id++) {
            gs->mgau_sl[nc++] = bit_id;
        }
        gs->mgau_sl[nc] = -1;
    }

    if (nc == 0) {
        E_INFO
            ("No active gaussian found in senone %d, with num. component = %d\n",
             m, n);
    }
    return nc;

}